

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t zip_read_data_deflate(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  size_t *psVar1;
  ushort uVar2;
  zip *zip;
  long lVar3;
  zip_entry *pzVar4;
  bool bVar5;
  wchar_t wVar6;
  uint uVar7;
  uchar *puVar8;
  uint8_t *in;
  uint32_t *puVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint8_t *out;
  char *fmt;
  uchar *in_len;
  int error_number;
  ssize_t bytes_avail;
  size_t dsize;
  uchar *local_40;
  uchar *local_38;
  
  zip = (zip *)a->format->data;
  if (zip->uncompressed_buffer == (uchar *)0x0) {
    zip->uncompressed_buffer_size = 0x40000;
    puVar8 = (uchar *)malloc(0x40000);
    zip->uncompressed_buffer = puVar8;
    if (puVar8 != (uchar *)0x0) goto LAB_004394c2;
    fmt = "No memory for ZIP decompression";
  }
  else {
LAB_004394c2:
    wVar6 = zip_deflate_init(a,zip);
    if (wVar6 != L'\0') {
      return wVar6;
    }
    in = (uint8_t *)__archive_read_ahead(a,1,(ssize_t *)&local_40);
    uVar2 = zip->entry->zip_flags;
    if (((uVar2 & 8) == 0) && ((long)zip->entry_bytes_remaining < (long)local_40)) {
      local_40 = (uchar *)zip->entry_bytes_remaining;
    }
    if ((long)local_40 < 0) {
      fmt = "Truncated ZIP file body";
      error_number = 0x54;
      goto LAB_004396a6;
    }
    if ((zip->tctx_valid != '\0') || (puVar8 = in, zip->cctx_valid != '\0')) {
      puVar8 = (uchar *)zip->decrypted_bytes_remaining;
      if (puVar8 < local_40) {
        out = zip->decrypted_ptr + (long)puVar8;
        in_len = zip->decrypted_buffer + (zip->decrypted_buffer_size - (long)out);
        if (local_40 <= zip->decrypted_buffer + (zip->decrypted_buffer_size - (long)out)) {
          in_len = local_40;
        }
        if ((((uVar2 & 8) == 0) && (lVar3 = zip->entry_bytes_remaining, 0 < lVar3)) &&
           (lVar3 < (long)(puVar8 + (long)in_len))) {
          in_len = (uchar *)0x0;
          if ((long)puVar8 <= lVar3) {
            in_len = (uchar *)(lVar3 - (long)puVar8);
          }
        }
        if (in_len != (uchar *)0x0) {
          if (zip->tctx_valid == '\0') {
            local_38 = in_len;
            aes_ctr_update(&zip->cctx,in,(size_t)in_len,out,(size_t *)&local_38);
          }
          else {
            trad_enc_decrypt_update(&zip->tctx,in,(size_t)in_len,out,(size_t)in_len);
          }
          zip->decrypted_bytes_remaining = (size_t)(in_len + zip->decrypted_bytes_remaining);
        }
      }
      local_40 = (uchar *)zip->decrypted_bytes_remaining;
      puVar8 = zip->decrypted_ptr;
    }
    (zip->stream).next_in = puVar8;
    (zip->stream).avail_in = (uInt)local_40;
    (zip->stream).total_in = 0;
    (zip->stream).next_out = zip->uncompressed_buffer;
    (zip->stream).avail_out = (uInt)zip->uncompressed_buffer_size;
    (zip->stream).total_out = 0;
    uVar7 = cm_zlib_inflate(&zip->stream,0);
    if (uVar7 != 0xfffffffc) {
      if (uVar7 != 0) {
        if (uVar7 != 1) {
          archive_set_error(&a->archive,-1,"ZIP decompression failed (%d)",(ulong)uVar7);
          return L'\xffffffe2';
        }
        zip->end_of_entry = '\x01';
      }
      local_40 = (uchar *)(zip->stream).total_in;
      if ((zip->tctx_valid != '\0') || (zip->cctx_valid != '\0')) {
        psVar1 = &zip->decrypted_bytes_remaining;
        *psVar1 = *psVar1 - (long)local_40;
        if (*psVar1 == 0) {
          zip->decrypted_ptr = zip->decrypted_buffer;
        }
        else {
          zip->decrypted_ptr = zip->decrypted_ptr + (long)local_40;
        }
      }
      if (zip->hctx_valid != '\0') {
        __hmac_sha1_update(&zip->hctx,in,(size_t)local_40);
      }
      __archive_read_consume(a,(int64_t)local_40);
      zip->entry_bytes_remaining = zip->entry_bytes_remaining - (long)local_40;
      zip->entry_compressed_bytes_read = (int64_t)(local_40 + zip->entry_compressed_bytes_read);
      *size = (zip->stream).total_out;
      zip->entry_uncompressed_bytes_read =
           zip->entry_uncompressed_bytes_read + (zip->stream).total_out;
      *buff = zip->uncompressed_buffer;
      if (((zip->end_of_entry != '\0') && (zip->hctx_valid != '\0')) &&
         (wVar6 = check_authentication_code(a,(void *)0x0), wVar6 != L'\0')) {
        return wVar6;
      }
      if (zip->end_of_entry == '\0') {
        return L'\0';
      }
      if ((zip->entry->zip_flags & 8) == 0) {
        return L'\0';
      }
      puVar9 = (uint32_t *)__archive_read_ahead(a,0x18,(ssize_t *)0x0);
      if (puVar9 == (uint32_t *)0x0) {
        bVar5 = false;
        archive_set_error(&a->archive,0x54,"Truncated ZIP end-of-file record");
        wVar6 = L'\xffffffe2';
      }
      else {
        if (((((char)*puVar9 == 'P') && (*(char *)((long)puVar9 + 1) == 'K')) &&
            (*(char *)((long)puVar9 + 2) == '\a')) && (*(char *)((long)puVar9 + 3) == '\b')) {
          puVar9 = puVar9 + 1;
          zip->unconsumed = 4;
        }
        pzVar4 = zip->entry;
        pzVar4->cm_zlib_crc32 = *puVar9;
        if ((pzVar4->flags & 1) == 0) {
          pzVar4->compressed_size = (ulong)puVar9[1];
          pzVar4->uncompressed_size = (ulong)puVar9[2];
          zip->unconsumed = zip->unconsumed + 0xc;
        }
        else {
          uVar10 = archive_le64dec(puVar9 + 1);
          uVar11 = archive_le64dec(puVar9 + 3);
          if ((long)(uVar10 | uVar11) < 0) {
            archive_set_error(&a->archive,0x54,"Overflow of 64-bit file sizes");
            wVar6 = L'\xffffffe7';
            bVar5 = false;
            goto LAB_00439866;
          }
          pzVar4->compressed_size = uVar10;
          pzVar4->uncompressed_size = uVar11;
          zip->unconsumed = zip->unconsumed + 0x14;
        }
        wVar6 = L'\xffffffe7';
        bVar5 = true;
      }
LAB_00439866:
      if (bVar5) {
        return L'\0';
      }
      return wVar6;
    }
    fmt = "Out of memory for ZIP decompression";
  }
  error_number = 0xc;
LAB_004396a6:
  archive_set_error(&a->archive,error_number,fmt);
  return L'\xffffffe2';
}

Assistant:

static int
zip_read_data_deflate(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset)
{
	struct zip *zip;
	ssize_t bytes_avail;
	const void *compressed_buff, *sp;
	int r;

	(void)offset; /* UNUSED */

	zip = (struct zip *)(a->format->data);

	/* If the buffer hasn't been allocated, allocate it now. */
	if (zip->uncompressed_buffer == NULL) {
		zip->uncompressed_buffer_size = 256 * 1024;
		zip->uncompressed_buffer
		    = (unsigned char *)malloc(zip->uncompressed_buffer_size);
		if (zip->uncompressed_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for ZIP decompression");
			return (ARCHIVE_FATAL);
		}
	}

	r = zip_deflate_init(a, zip);
	if (r != ARCHIVE_OK)
		return (r);

	/*
	 * Note: '1' here is a performance optimization.
	 * Recall that the decompression layer returns a count of
	 * available bytes; asking for more than that forces the
	 * decompressor to combine reads by copying data.
	 */
	compressed_buff = sp = __archive_read_ahead(a, 1, &bytes_avail);
	if (0 == (zip->entry->zip_flags & ZIP_LENGTH_AT_END)
	    && bytes_avail > zip->entry_bytes_remaining) {
		bytes_avail = (ssize_t)zip->entry_bytes_remaining;
	}
	if (bytes_avail < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated ZIP file body");
		return (ARCHIVE_FATAL);
	}

	if (zip->tctx_valid || zip->cctx_valid) {
		if (zip->decrypted_bytes_remaining < (size_t)bytes_avail) {
			size_t buff_remaining =
			    (zip->decrypted_buffer + zip->decrypted_buffer_size)
			    - (zip->decrypted_ptr + zip->decrypted_bytes_remaining);

			if (buff_remaining > (size_t)bytes_avail)
				buff_remaining = (size_t)bytes_avail;

			if (0 == (zip->entry->zip_flags & ZIP_LENGTH_AT_END) &&
			      zip->entry_bytes_remaining > 0) {
				if ((int64_t)(zip->decrypted_bytes_remaining
				    + buff_remaining)
				      > zip->entry_bytes_remaining) {
					if (zip->entry_bytes_remaining <
					      (int64_t)zip->decrypted_bytes_remaining)
						buff_remaining = 0;
					else
						buff_remaining =
						    (size_t)zip->entry_bytes_remaining
						      - zip->decrypted_bytes_remaining;
				}
			}
			if (buff_remaining > 0) {
				if (zip->tctx_valid) {
					trad_enc_decrypt_update(&zip->tctx,
					    compressed_buff, buff_remaining,
					    zip->decrypted_ptr
					      + zip->decrypted_bytes_remaining,
					    buff_remaining);
				} else {
					size_t dsize = buff_remaining;
					archive_decrypto_aes_ctr_update(
					    &zip->cctx,
					    compressed_buff, buff_remaining,
					    zip->decrypted_ptr
					      + zip->decrypted_bytes_remaining,
					    &dsize);
				}
				zip->decrypted_bytes_remaining += buff_remaining;
			}
		}
		bytes_avail = zip->decrypted_bytes_remaining;
		compressed_buff = (const char *)zip->decrypted_ptr;
	}

	/*
	 * A bug in zlib.h: stream.next_in should be marked 'const'
	 * but isn't (the library never alters data through the
	 * next_in pointer, only reads it).  The result: this ugly
	 * cast to remove 'const'.
	 */
	zip->stream.next_in = (Bytef *)(uintptr_t)(const void *)compressed_buff;
	zip->stream.avail_in = (uInt)bytes_avail;
	zip->stream.total_in = 0;
	zip->stream.next_out = zip->uncompressed_buffer;
	zip->stream.avail_out = (uInt)zip->uncompressed_buffer_size;
	zip->stream.total_out = 0;

	r = inflate(&zip->stream, 0);
	switch (r) {
	case Z_OK:
		break;
	case Z_STREAM_END:
		zip->end_of_entry = 1;
		break;
	case Z_MEM_ERROR:
		archive_set_error(&a->archive, ENOMEM,
		    "Out of memory for ZIP decompression");
		return (ARCHIVE_FATAL);
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "ZIP decompression failed (%d)", r);
		return (ARCHIVE_FATAL);
	}

	/* Consume as much as the compressor actually used. */
	bytes_avail = zip->stream.total_in;
	if (zip->tctx_valid || zip->cctx_valid) {
		zip->decrypted_bytes_remaining -= bytes_avail;
		if (zip->decrypted_bytes_remaining == 0)
			zip->decrypted_ptr = zip->decrypted_buffer;
		else
			zip->decrypted_ptr += bytes_avail;
	}
	/* Calculate compressed data as much as we used.*/
	if (zip->hctx_valid)
		archive_hmac_sha1_update(&zip->hctx, sp, bytes_avail);
	__archive_read_consume(a, bytes_avail);
	zip->entry_bytes_remaining -= bytes_avail;
	zip->entry_compressed_bytes_read += bytes_avail;

	*size = zip->stream.total_out;
	zip->entry_uncompressed_bytes_read += zip->stream.total_out;
	*buff = zip->uncompressed_buffer;

	if (zip->end_of_entry && zip->hctx_valid) {
		r = check_authentication_code(a, NULL);
		if (r != ARCHIVE_OK)
			return (r);
	}

	if (zip->end_of_entry && (zip->entry->zip_flags & ZIP_LENGTH_AT_END)) {
		const char *p;

		if (NULL == (p = __archive_read_ahead(a, 24, NULL))) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated ZIP end-of-file record");
			return (ARCHIVE_FATAL);
		}
		/* Consume the optional PK\007\010 marker. */
		if (p[0] == 'P' && p[1] == 'K' &&
		    p[2] == '\007' && p[3] == '\010') {
			p += 4;
			zip->unconsumed = 4;
		}
		if (zip->entry->flags & LA_USED_ZIP64) {
			uint64_t compressed, uncompressed;
			zip->entry->crc32 = archive_le32dec(p);
			compressed = archive_le64dec(p + 4);
			uncompressed = archive_le64dec(p + 12);
			if (compressed > INT64_MAX || uncompressed > INT64_MAX) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Overflow of 64-bit file sizes");
				return ARCHIVE_FAILED;
			}
			zip->entry->compressed_size = compressed;
			zip->entry->uncompressed_size = uncompressed;
			zip->unconsumed += 20;
		} else {
			zip->entry->crc32 = archive_le32dec(p);
			zip->entry->compressed_size = archive_le32dec(p + 4);
			zip->entry->uncompressed_size = archive_le32dec(p + 8);
			zip->unconsumed += 12;
		}
	}

	return (ARCHIVE_OK);
}